

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_DimAngular::CreateFromPoints
          (ON_OBSOLETE_V5_DimAngular *this,ON_3dPoint *pc,ON_3dPoint *p0in,ON_3dPoint *p1in,
          ON_3dPoint *arcpt,ON_3dVector *Normal)

{
  double *t;
  double dVar1;
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  ON_3dPoint p_02;
  ON_3dPoint p_03;
  double s;
  bool bVar2;
  ON_3dVector *pOVar3;
  ON_AngularDimension2Extra *pOVar4;
  long lVar5;
  ON_Plane *pOVar6;
  ON_Plane *pOVar7;
  byte bVar8;
  ON_2dVector local_168;
  double a1;
  ON_2dVector v0;
  ON_2dPoint pp1;
  ON_2dPoint pp0;
  double aa;
  ON_2dPoint pa;
  ON_3dPoint p0;
  ON_3dPoint p1;
  ON_2dVector local_c0;
  ON_Plane plane;
  
  bVar8 = 0;
  p_03 = *p0in;
  p_02 = *p0in;
  p = *p0in;
  p_01 = *p1in;
  p_00 = *p1in;
  ON_Plane::ON_Plane(&plane,pc,Normal);
  t = &pp0.y;
  bVar2 = ON_Plane::ClosestPointTo(&plane,p,&pp0.x,t);
  if (bVar2) {
    ON_2dVector::ON_2dVector(&v0,&pp0);
    ON_2dVector::Unitize(&v0);
    bVar2 = ON_2dVector::IsValid(&v0);
    if (bVar2) {
      bVar2 = ON_2dVector::IsNotZero(&v0);
      s = v0.y;
      dVar1 = v0.x;
      if (bVar2) {
        pOVar3 = ON_Plane::Normal(&plane);
        ON_Plane::Rotate(&plane,s,dVar1,pOVar3);
      }
    }
    bVar2 = ON_Plane::ClosestPointTo(&plane,p_03,&pp0.x,t);
    if (bVar2) {
      bVar2 = ON_Plane::ClosestPointTo(&plane,*arcpt,&pa.x,&pa.y);
      if (bVar2) {
        bVar2 = ON_Plane::ClosestPointTo(&plane,p_00,&pp1.x,&pp1.y);
        if (bVar2) {
          a1 = ON_DBL_QNAN;
          aa = ON_DBL_QNAN;
          ON_2dVector::ON_2dVector(&local_168,&pp1);
          bVar2 = VectorAngle(&local_168,&a1);
          if (bVar2) {
            ON_2dVector::ON_2dVector(&local_c0,&pa);
            bVar2 = VectorAngle(&local_c0,&aa);
            if (bVar2) {
              if (aa <= a1) {
LAB_004c4b20:
                ON_2dVector::ON_2dVector(&local_168,&pp1);
                VectorAngle(&local_168,&a1);
                this->m_angle = a1;
                ON_2dVector::ON_2dVector(&local_168,&pa);
                dVar1 = ON_2dVector::Length(&local_168);
                this->m_radius = dVar1;
                pOVar4 = ON_AngularDimension2Extra::AngularDimensionExtra(this);
                if (pOVar4 != (ON_AngularDimension2Extra *)0x0) {
                  ON_2dVector::ON_2dVector(&local_168,&pp0);
                  dVar1 = ON_2dVector::Length(&local_168);
                  pOVar4->m_dimpoint_offset[0] = dVar1;
                  ON_2dVector::ON_2dVector(&local_168,&pp1);
                  dVar1 = ON_2dVector::Length(&local_168);
                  pOVar4->m_dimpoint_offset[1] = dVar1;
                }
                ON_OBSOLETE_V5_Annotation::ReservePoints(&this->super_ON_OBSOLETE_V5_Annotation,4);
                pOVar6 = &plane;
                pOVar7 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
                for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
                  (pOVar7->origin).x = (pOVar6->origin).x;
                  pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
                  pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
                }
                ON_OBSOLETE_V5_Annotation::SetPoint(&this->super_ON_OBSOLETE_V5_Annotation,1,&pp0);
                ON_OBSOLETE_V5_Annotation::SetPoint(&this->super_ON_OBSOLETE_V5_Annotation,2,&pp1);
                bVar2 = true;
                ON_OBSOLETE_V5_Annotation::SetPoint(&this->super_ON_OBSOLETE_V5_Annotation,3,&pa);
                goto LAB_004c4c1b;
              }
              ON_2dVector::Set(&v0,pp1.x,pp1.y);
              ON_2dVector::Unitize(&v0);
              pOVar3 = ON_Plane::Normal(&plane);
              ON_Plane::Rotate(&plane,v0.y,v0.x,pOVar3);
              bVar2 = ON_Plane::ClosestPointTo(&plane,*arcpt,&pa.x,&pa.y);
              if (bVar2) {
                bVar2 = ON_Plane::ClosestPointTo(&plane,p_01,&pp0.x,t);
                if (bVar2) {
                  bVar2 = ON_Plane::ClosestPointTo(&plane,p_02,&pp1.x,&pp1.y);
                  if (bVar2) goto LAB_004c4b20;
                }
              }
            }
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_004c4c1b:
  ON_Plane::~ON_Plane(&plane);
  return bVar2;
}

Assistant:

bool ON_OBSOLETE_V5_DimAngular::CreateFromPoints( 
            const ON_3dPoint& pc, 
            const ON_3dPoint& p0in,
            const ON_3dPoint& p1in,
            ON_3dPoint& arcpt, 
            ON_3dVector& Normal)
{
  ON_3dPoint p0, p1;
  p0 = p0in;
  p1 = p1in;

  ON_Plane plane( pc, Normal);

  ON_2dPoint pa, pp0, pp1;

  if( !plane.ClosestPointTo( p0, &pp0.x, &pp0.y))
    return false;

  // rotate so that p0 is on x-axis
  ON_2dVector v0( pp0);
  v0.Unitize();
  if ( v0.IsValid() && v0.IsNotZero() )
    plane.Rotate( v0.y, v0.x, plane.Normal());

  if( !plane.ClosestPointTo( p0, &pp0.x, &pp0.y))
    return false;

  if( !plane.ClosestPointTo( arcpt, &pa.x, &pa.y))
    return false;

  if( !plane.ClosestPointTo( p1, &pp1.x, &pp1.y))
    return false;

  double a1 = ON_DBL_QNAN;
  double aa = ON_DBL_QNAN;
  if( !VectorAngle( ON_2dVector( pp1), a1) || !VectorAngle( ON_2dVector( pa), aa))    
    return false;

  if( aa > a1)  // the angle is really the bigger one ( > 180)
  {
    // rotate so that p0 is on x-axis
    v0.Set( pp1.x, pp1.y);
    v0.Unitize();
    plane.Rotate( v0.y, v0.x, plane.Normal());

    if( !plane.ClosestPointTo( arcpt, &pa.x, &pa.y))
      return false;
    if( !plane.ClosestPointTo( p1, &pp0.x, &pp0.y))
      return false;
    if( !plane.ClosestPointTo( p0, &pp1.x, &pp1.y))
      return false;
  }

  VectorAngle( ON_2dVector( pp1), a1);

  SetAngle( a1);
  SetRadius( ON_2dVector( pa).Length());

  ON_AngularDimension2Extra* pDE = ON_AngularDimension2Extra::AngularDimensionExtra(this);
  if(pDE != 0)
  {
    double os = ((ON_2dVector)pp0).Length();
    pDE->SetDimpointOffset(0, os);
    os = ((ON_2dVector)pp1).Length();
    pDE->SetDimpointOffset(1, os);
  }

  ReservePoints( 4);
  SetPlane( plane);
  SetPoint( 1, pp0);
  SetPoint( 2, pp1);
  SetPoint( 3, pa);


  return true;
}